

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromise_p.h
# Opt level: O2

void QtPromisePrivate::PromiseFulfill<QtPromise::QPromise<QList<QString>>>::
     call<QtPromise::QPromiseResolve<QList<QString>>,QtPromise::QPromiseReject<QList<QString>>>
               (QPromise<QList<QString>_> *promise,QPromiseResolve<QList<QString>_> *resolve,
               QPromiseReject<QList<QString>_> *reject)

{
  QSharedData *pQVar1;
  bool bVar2;
  anon_class_24_2_d74e9aa7 local_58;
  Data *local_40;
  undefined **local_38;
  PromiseData<QList<QString>_> *local_30;
  QPromiseBase<void> local_28;
  
  bVar2 = QtPromise::QPromiseBase<QList<QString>_>::isFulfilled
                    (&promise->super_QPromiseBase<QList<QString>_>);
  if (bVar2) {
    PromiseResolver<QList<QString>>::resolve<QtPromisePrivate::PromiseValue<QList<QString>>const&>
              ((PromiseResolver<QList<QString>> *)resolve,
               &((promise->super_QPromiseBase<QList<QString>_>).m_d.d)->m_value);
    return;
  }
  bVar2 = QtPromise::QPromiseBase<QList<QString>_>::isRejected
                    (&promise->super_QPromiseBase<QList<QString>_>);
  if (bVar2) {
    PromiseResolver<QList<QString>>::reject<QtPromisePrivate::PromiseError_const&>
              ((PromiseResolver<QList<QString>> *)reject,
               &(((promise->super_QPromiseBase<QList<QString>_>).m_d.d)->
                super_PromiseDataBase<QList<QString>,_void_(const_QList<QString>_&)>).m_error);
    return;
  }
  local_58.reject.m_resolver.m_d.d = (PromiseResolver<QList<QString>_>)(resolve->m_resolver).m_d.d;
  if (local_58.reject.m_resolver.m_d.d !=
      (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<QString>_>::Data>)0x0) {
    LOCK();
    (((Data *)local_58.reject.m_resolver.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value =
         (Type)((int)(((Data *)local_58.reject.m_resolver.m_d.d)->super_QSharedData).ref.
                     super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value + 1);
    UNLOCK();
  }
  local_58.promise.super_QPromiseBase<QList<QString>_>.m_d.d =
       (promise->super_QPromiseBase<QList<QString>_>).m_d.d;
  if (local_58.promise.super_QPromiseBase<QList<QString>_>.m_d.d !=
      (PromiseData<QList<QString>_> *)0x0) {
    LOCK();
    pQVar1 = &((local_58.promise.super_QPromiseBase<QList<QString>_>.m_d.d)->
              super_PromiseDataBase<QList<QString>,_void_(const_QList<QString>_&)>).
              super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_58.promise.super_QPromiseBase<QList<QString>_>._vptr_QPromiseBase =
       (_func_int **)&PTR__QPromiseBase_0014b470;
  local_40 = (reject->m_resolver).m_d.d;
  if (local_40 != (Data *)0x0) {
    LOCK();
    (local_40->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value = (Type)((int)(local_40->super_QSharedData).ref.super_QAtomicInteger<int>.
                           super_QBasicAtomicInteger<int>._q_value + 1);
    UNLOCK();
  }
  local_30 = (promise->super_QPromiseBase<QList<QString>_>).m_d.d;
  if (local_30 != (PromiseData<QList<QString>_> *)0x0) {
    LOCK();
    pQVar1 = &(local_30->super_PromiseDataBase<QList<QString>,_void_(const_QList<QString>_&)>).
              super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_38 = &PTR__QPromiseBase_0014b470;
  QtPromise::QPromiseBase<QList<QString>>::
  then<QtPromisePrivate::PromiseFulfill<QtPromise::QPromise<QList<QString>>>::call<QtPromise::QPromiseResolve<QList<QString>>,QtPromise::QPromiseReject<QList<QString>>>(QtPromise::QPromise<QList<QString>>const&,QtPromise::QPromiseResolve<QList<QString>>const&,QtPromise::QPromiseReject<QList<QString>>const&)::_lambda()_1_,QtPromisePrivate::PromiseFulfill<QtPromise::QPromise<QList<QString>>>::call<QtPromise::QPromiseResolve<QList<QString>>,QtPromise::QPromiseReject<QList<QString>>>(QtPromise::QPromise<QList<QString>>const&,QtPromise::QPromiseResolve<QList<QString>>const&,QtPromise::QPromiseReject<QList<QString>>const&)::_lambda()_2_>
            ((QPromiseBase<QList<QString>> *)&local_28,(anon_class_24_2_e6a34898 *)promise,&local_58
            );
  QtPromise::QPromiseBase<void>::~QPromiseBase(&local_28);
  call<QtPromise::QPromiseResolve<QList<QString>>,QtPromise::QPromiseReject<QList<QString>>>(QtPromise::QPromise<QList<QString>>const&,QtPromise::QPromiseResolve<QList<QString>>const&,QtPromise::QPromiseReject<QList<QString>>const&)
  ::{lambda()#2}::~call((_lambda___2_ *)&local_40);
  call<QtPromise::QPromiseResolve<QList<QString>>,QtPromise::QPromiseReject<QList<QString>>>(QtPromise::QPromise<QList<QString>>const&,QtPromise::QPromiseResolve<QList<QString>>const&,QtPromise::QPromiseReject<QList<QString>>const&)
  ::{lambda()#1}::~call((_lambda___1_ *)&local_58);
  return;
}

Assistant:

static void
    call(const QtPromise::QPromise<T>& promise, const TResolve& resolve, const TReject& reject)
    {
        if (promise.isFulfilled()) {
            resolve(promise.m_d->value());
        } else if (promise.isRejected()) {
            reject(promise.m_d->error());
        } else {
            promise.then(
                [=]() {
                    resolve(promise.m_d->value());
                },
                [=]() { // catch all
                    reject(promise.m_d->error());
                });
        }
    }